

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::MILSpec::DictionaryType::SerializeWithCachedSizes
          (DictionaryType *this,CodedOutputStream *output)

{
  if (this->keytype_ != (ValueType *)0x0 &&
      this != (DictionaryType *)&_DictionaryType_default_instance_) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (1,&this->keytype_->super_MessageLite,output);
  }
  if (this->valuetype_ != (ValueType *)0x0 &&
      this != (DictionaryType *)&_DictionaryType_default_instance_) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (2,&this->valuetype_->super_MessageLite,output);
    return;
  }
  return;
}

Assistant:

void DictionaryType::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.MILSpec.DictionaryType)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // .CoreML.Specification.MILSpec.ValueType keyType = 1;
  if (this->has_keytype()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      1, *this->keytype_, output);
  }

  // .CoreML.Specification.MILSpec.ValueType valueType = 2;
  if (this->has_valuetype()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      2, *this->valuetype_, output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.MILSpec.DictionaryType)
}